

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Node ** kj::_::
        CopyConstructArray_<capnp::compiler::Compiler::Node_*,_capnp::compiler::Compiler::Node_**,_true,_false>
        ::apply(Node **pos,Node **start,Node **end)

{
  Node **params;
  Node **end_local;
  Node **start_local;
  Node **pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<capnp::compiler::Compiler::Node*>(end_local);
    ctor<capnp::compiler::Compiler::Node*,capnp::compiler::Compiler::Node*>(start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }